

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

RELEASED_HANDLE released_clone(RELEASED_HANDLE value)

{
  AMQP_VALUE pAVar1;
  RELEASED_HANDLE local_18;
  RELEASED_INSTANCE *released_instance;
  RELEASED_HANDLE value_local;
  
  local_18 = (RELEASED_HANDLE)malloc(8);
  if (local_18 != (RELEASED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (RELEASED_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

RELEASED_HANDLE released_clone(RELEASED_HANDLE value)
{
    RELEASED_INSTANCE* released_instance = (RELEASED_INSTANCE*)malloc(sizeof(RELEASED_INSTANCE));
    if (released_instance != NULL)
    {
        released_instance->composite_value = amqpvalue_clone(((RELEASED_INSTANCE*)value)->composite_value);
        if (released_instance->composite_value == NULL)
        {
            free(released_instance);
            released_instance = NULL;
        }
    }

    return released_instance;
}